

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::PropertyIdOnRegSlotsContainer::CreateRegSlotsArray
          (PropertyIdOnRegSlotsContainer *this,Recycler *recycler,uint _length)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  int *piVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->propertyIdsForRegSlots).ptr != (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x15fe,"(propertyIdsForRegSlots == nullptr)",
                                "propertyIdsForRegSlots == nullptr");
    if (!bVar2) goto LAB_00774d90;
    *puVar4 = 0;
  }
  local_58 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x15ff;
  data.plusSize = (ulong)_length;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  if (_length == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    piVar5 = (int *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00774d90;
      *puVar4 = 0;
    }
    piVar5 = (int *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                              (this_00,(ulong)_length << 2);
    if (piVar5 == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00774d90:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->propertyIdsForRegSlots).ptr = piVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  this->length = _length;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::CreateRegSlotsArray(Recycler * recycler, uint _length)
    {
        Assert(propertyIdsForRegSlots == nullptr);
        propertyIdsForRegSlots = RecyclerNewArrayLeafZ(recycler, PropertyId, _length);
        length = _length;
    }